

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

EbmlElement * __thiscall libebml::EbmlMaster::AddNewElt(EbmlMaster *this,EbmlCallbacks *Callbacks)

{
  bool bVar1;
  EbmlMaster *local_28;
  EbmlElement *NewElt;
  EbmlCallbacks *Callbacks_local;
  EbmlMaster *this_local;
  
  local_28 = (EbmlMaster *)(*Callbacks->Create)();
  if (local_28 == (EbmlMaster *)0x0) {
    this_local = (EbmlMaster *)0x0;
  }
  else {
    bVar1 = PushElement(this,(EbmlElement *)local_28);
    if (!bVar1) {
      if (local_28 != (EbmlMaster *)0x0) {
        (*(local_28->super_EbmlElement)._vptr_EbmlElement[1])();
      }
      local_28 = (EbmlMaster *)0x0;
    }
    this_local = local_28;
  }
  return &this_local->super_EbmlElement;
}

Assistant:

EbmlElement *EbmlMaster::AddNewElt(const EbmlCallbacks & Callbacks)
{
  // add the element
  EbmlElement *NewElt = &EBML_INFO_CREATE(Callbacks);
  if (NewElt == NULL)
    return NULL;

  if (!PushElement(*NewElt)) {
    delete NewElt;
    NewElt = NULL;
  }
  return NewElt;
}